

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O2

bool __thiscall
cmTargetLinkLibrariesCommand::HandleLibrary
          (cmTargetLinkLibrariesCommand *this,string *lib,cmTargetLinkLibraryType llt)

{
  ProcessingState PVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  PolicyStatus PVar5;
  ostream *poVar6;
  cmGlobalGenerator *this_00;
  cmTarget *pcVar7;
  size_type sVar8;
  cmake *this_01;
  PolicyID id;
  PolicyID id_00;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  MessageType t;
  string *dc;
  pointer pbVar12;
  pointer pbVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  allocator<char> local_1e9;
  string libRef;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  pcVar7 = this->Target;
  PVar1 = this->CurrentProcessingState;
  if (PVar1 != ProcessingKeywordLinkInterface && pcVar7->TargetTypeValue == INTERFACE_LIBRARY) {
    pcVar2 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,
               "INTERFACE library can only be used with the INTERFACE keyword of target_link_libraries"
               ,(allocator<char> *)&libRef);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e);
LAB_00236446:
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  if (pcVar7->IsImportedTarget == true && PVar1 != ProcessingKeywordLinkInterface) {
    pcVar2 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,
               "IMPORTED library can only be used with the INTERFACE keyword of target_link_libraries"
               ,(allocator<char> *)&libRef);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&e);
    goto LAB_00236446;
  }
  uVar9 = PVar1 - ProcessingKeywordLinkInterface;
  cmMakefile::GetExecutionContext((cmListFileContext *)&e,(this->super_cmCommand).Makefile);
  bVar3 = cmTarget::PushTLLCommandTrace(pcVar7,(uint)(4 < uVar9),(cmListFileContext *)&e);
  cmListFileContext::~cmListFileContext((cmListFileContext *)&e);
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    PVar5 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0023,false);
    if (PVar5 - NEW < 3) {
      t = FATAL_ERROR;
      pcVar11 = "must";
      bVar3 = true;
LAB_002364b3:
      poVar6 = std::operator<<((ostream *)&e,"The ");
      pcVar10 = "keyword";
      if (uVar9 < 5) {
        pcVar10 = "plain";
      }
      poVar6 = std::operator<<(poVar6,pcVar10);
      poVar6 = std::operator<<(poVar6,
                               " signature for target_link_libraries has already been used with the target \""
                              );
      poVar6 = std::operator<<(poVar6,(string *)&this->Target->Name);
      poVar6 = std::operator<<(poVar6,"\".  All uses of target_link_libraries with a target ");
      poVar6 = std::operator<<(poVar6,pcVar11);
      std::operator<<(poVar6," be either all-keyword or all-plain.\n");
      cmTarget::GetTllSignatureTraces(this->Target,(ostream *)&e,(uint)(uVar9 < 5));
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,t,&libRef);
      std::__cxx11::string::~string((string *)&libRef);
      if (bVar3) {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        return false;
      }
    }
    else if (PVar5 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&libRef,(cmPolicies *)0x17,id);
      poVar6 = std::operator<<((ostream *)&e,(string *)&libRef);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)&libRef);
      pcVar11 = "should";
      bVar3 = false;
      t = AUTHOR_WARNING;
      goto LAB_002364b3;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  if (pcVar2 == this->Target->Makefile) {
    bVar4 = false;
    bVar3 = false;
LAB_00236683:
    libRef._M_dataplus._M_p = (pointer)&libRef.field_2;
    libRef._M_string_length = 0;
    libRef.field_2._M_local_buf[0] = '\0';
LAB_00236694:
    std::__cxx11::string::_M_assign((string *)&libRef);
    if (1 < this->CurrentProcessingState - ProcessingPlainLinkInterface) {
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar6 = std::operator<<((ostream *)&e,"Attempt to add link library \"");
        poVar6 = std::operator<<(poVar6,(string *)lib);
        poVar6 = std::operator<<(poVar6,"\" to target \"");
        poVar6 = std::operator<<(poVar6,(string *)&this->Target->Name);
        poVar6 = std::operator<<(poVar6,"\" which is not built in this directory.\n");
        std::operator<<(poVar6,"This is allowed only when policy CMP0079 is set to NEW.");
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        bVar3 = false;
        goto LAB_00236a81;
      }
LAB_0023675b:
      this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      pcVar7 = cmGlobalGenerator::FindTarget(this_00,lib,false);
      if ((pcVar7 != (cmTarget *)0x0) &&
         (((UNKNOWN_LIBRARY < pcVar7->TargetTypeValue ||
           ((0x196U >> (pcVar7->TargetTypeValue & 0x1f) & 1) == 0)) &&
          (bVar3 = cmTarget::IsExecutableWithExports(pcVar7), !bVar3)))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar6 = std::operator<<((ostream *)&e,"Target \"");
        poVar6 = std::operator<<(poVar6,(string *)lib);
        poVar6 = std::operator<<(poVar6,"\" of type ");
        pcVar11 = cmState::GetTargetTypeName(pcVar7->TargetTypeValue);
        poVar6 = std::operator<<(poVar6,pcVar11);
        std::operator<<(poVar6,
                        " may not be linked into another target.  One may link only to INTERFACE, OBJECT, STATIC or SHARED libraries, or to executables with the ENABLE_EXPORTS property set."
                       );
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
      cmTarget::AddLinkLibrary(this->Target,(this->super_cmCommand).Makefile,lib,&libRef,llt);
    }
    if (bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_210,(cmPolicies *)0x4f,id_00);
      poVar6 = std::operator<<((ostream *)&e,(string *)&local_210);
      poVar6 = std::operator<<(poVar6,"\nTarget\n  ");
      poVar6 = std::operator<<(poVar6,(string *)&this->Target->Name);
      poVar6 = std::operator<<(poVar6,
                               "\nis not created in this directory.  For compatibility with older versions of CMake, link library\n  "
                              );
      poVar6 = std::operator<<(poVar6,(string *)lib);
      std::operator<<(poVar6,
                      "\nwill be looked up in the directory in which the target was created rather than in this calling directory."
                     );
      std::__cxx11::string::~string((string *)&local_210);
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
  }
  else {
    bVar4 = false;
    PVar5 = cmMakefile::GetPolicyStatus(pcVar2,CMP0079,false);
    if (2 < PVar5 - NEW) {
      if (PVar5 == OLD) {
        bVar3 = true;
        bVar4 = false;
      }
      else {
        bVar3 = false;
        if (PVar5 == WARN) {
          bVar4 = true;
          bVar3 = true;
        }
      }
      goto LAB_00236683;
    }
    libRef._M_dataplus._M_p = (pointer)&libRef.field_2;
    libRef._M_string_length = 0;
    libRef.field_2._M_local_buf[0] = '\0';
    bVar3 = cmsys::SystemTools::FileIsFullPath(lib);
    if (bVar3) {
      bVar3 = false;
      bVar4 = false;
      goto LAB_00236694;
    }
    cmMakefile::GetDirectoryId((cmDirectoryId *)&e,(this->super_cmCommand).Makefile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &debugConfigs,lib,"::@");
    std::operator+(&local_210,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &debugConfigs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
    std::__cxx11::string::operator=((string *)&libRef,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&debugConfigs);
    std::__cxx11::string::~string((string *)&e);
    if (1 < this->CurrentProcessingState - ProcessingPlainLinkInterface) {
      bVar4 = false;
      goto LAB_0023675b;
    }
  }
  pcVar7 = this->Target;
  if (this->CurrentProcessingState - ProcessingPlainPrivateInterface < 2) {
    bVar3 = true;
    if ((pcVar7->TargetTypeValue == OBJECT_LIBRARY) || (pcVar7->TargetTypeValue == STATIC_LIBRARY))
    {
      cmTarget::GetDebugGeneratorExpressions((string *)&e,pcVar7,&libRef,llt);
      bVar4 = cmGeneratorExpression::IsValidTargetName(&libRef);
      if ((bVar4) || (sVar8 = cmGeneratorExpression::Find(&libRef), sVar8 != 0xffffffffffffffff)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &debugConfigs,"$<LINK_ONLY:",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
        std::operator+(&local_210,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &debugConfigs,">");
        std::__cxx11::string::operator=((string *)&e,(string *)&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&debugConfigs);
      }
      pcVar7 = this->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"INTERFACE_LINK_LIBRARIES",(allocator<char> *)&debugConfigs);
      cmTarget::AppendProperty(pcVar7,&local_210,_e,false);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&e);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"INTERFACE_LINK_LIBRARIES",(allocator<char> *)&debugConfigs);
    cmTarget::GetDebugGeneratorExpressions(&local_210,this->Target,&libRef,llt);
    cmTarget::AppendProperty(pcVar7,(string *)&e,local_210._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&e);
    bVar3 = true;
    if (((this->CurrentProcessingState != ProcessingLinkLibraries) &&
        (PVar5 = cmTarget::GetPolicyStatusCMP0022(this->Target), PVar5 < NEW)) &&
       (this->Target->TargetTypeValue != INTERFACE_LIBRARY)) {
      this_01 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      cmake::GetDebugConfigs_abi_cxx11_(&debugConfigs,this_01);
      pbVar13 = debugConfigs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      _e = (pointer)local_198;
      local_198[0]._M_local_buf[0] = '\0';
      if (llt < OPTIMIZED_LibraryType) {
        for (pbVar12 = debugConfigs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar13;
            pbVar12 = pbVar12 + 1) {
          std::__cxx11::string::assign((char *)&e);
          std::__cxx11::string::append((string *)&e);
          cmTarget::AppendProperty(this->Target,(string *)&e,libRef._M_dataplus._M_p,false);
        }
      }
      if ((llt & ~OPTIMIZED_LibraryType) == GENERAL_LibraryType) {
        pcVar7 = this->Target;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,"LINK_INTERFACE_LIBRARIES",&local_1e9);
        cmTarget::AppendProperty(pcVar7,&local_210,libRef._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&local_210);
        for (pbVar13 = debugConfigs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar13 !=
            debugConfigs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar13 = pbVar13 + 1) {
          std::__cxx11::string::assign((char *)&e);
          std::__cxx11::string::append((string *)&e);
          pcVar11 = cmTarget::GetProperty(this->Target,(string *)&e);
          if (pcVar11 == (char *)0x0) {
            cmTarget::SetProperty(this->Target,(string *)&e,"");
          }
        }
      }
      std::__cxx11::string::~string((string *)&e);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&debugConfigs);
    }
  }
LAB_00236a81:
  std::__cxx11::string::~string((string *)&libRef);
  return bVar3;
}

Assistant:

bool cmTargetLinkLibrariesCommand::HandleLibrary(const std::string& lib,
                                                 cmTargetLinkLibraryType llt)
{
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
      this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "INTERFACE library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }
  if (this->Target->IsImported() &&
      this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "IMPORTED library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }

  cmTarget::TLLSignature sig =
    (this->CurrentProcessingState == ProcessingPlainPrivateInterface ||
     this->CurrentProcessingState == ProcessingPlainPublicInterface ||
     this->CurrentProcessingState == ProcessingKeywordPrivateInterface ||
     this->CurrentProcessingState == ProcessingKeywordPublicInterface ||
     this->CurrentProcessingState == ProcessingKeywordLinkInterface)
    ? cmTarget::KeywordTLLSignature
    : cmTarget::PlainTLLSignature;
  if (!this->Target->PushTLLCommandTrace(
        sig, this->Makefile->GetExecutionContext())) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0023)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0023) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
    }

    if (modal) {
      // If the sig is a keyword form and there is a conflict, the existing
      // form must be the plain form.
      const char* existingSig =
        (sig == cmTarget::KeywordTLLSignature ? "plain" : "keyword");
      e << "The " << existingSig
        << " signature for target_link_libraries has "
           "already been used with the target \""
        << this->Target->GetName()
        << "\".  All uses of target_link_libraries with a target " << modal
        << " be either all-keyword or all-plain.\n";
      this->Target->GetTllSignatureTraces(e,
                                          sig == cmTarget::KeywordTLLSignature
                                            ? cmTarget::PlainTLLSignature
                                            : cmTarget::KeywordTLLSignature);
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  bool warnRemoteInterface = false;
  bool rejectRemoteLinking = false;
  bool encodeRemoteReference = false;
  if (this->Makefile != this->Target->GetMakefile()) {
    // The LHS target was created in another directory.
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0079)) {
      case cmPolicies::WARN:
        warnRemoteInterface = true;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        rejectRemoteLinking = true;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        encodeRemoteReference = true;
        break;
    }
  }

  std::string libRef;
  if (encodeRemoteReference && !cmSystemTools::FileIsFullPath(lib)) {
    // This is a library name added by a caller that is not in the
    // same directory as the target was created.  Add a suffix to
    // the name to tell ResolveLinkItem to look up the name in the
    // caller's directory.
    cmDirectoryId const dirId = this->Makefile->GetDirectoryId();
    libRef = lib + CMAKE_DIRECTORY_ID_SEP + dirId.String;
  } else {
    // This is an absolute path or a library name added by a caller
    // in the same directory as the target was created.  We can use
    // the original name directly.
    libRef = lib;
  }

  // Handle normal case where the command was called with another keyword than
  // INTERFACE / LINK_INTERFACE_LIBRARIES or none at all. (The "LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  if (this->CurrentProcessingState != ProcessingKeywordLinkInterface &&
      this->CurrentProcessingState != ProcessingPlainLinkInterface) {

    if (rejectRemoteLinking) {
      std::ostringstream e;
      e << "Attempt to add link library \"" << lib << "\" to target \""
        << this->Target->GetName()
        << "\" which is not built in this directory.\n"
        << "This is allowed only when policy CMP0079 is set to NEW.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return false;
    }

    cmTarget* tgt = this->Makefile->GetGlobalGenerator()->FindTarget(lib);

    if (tgt && (tgt->GetType() != cmStateEnums::STATIC_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::UNKNOWN_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::OBJECT_LIBRARY) &&
        (tgt->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
        !tgt->IsExecutableWithExports()) {
      std::ostringstream e;
      e << "Target \"" << lib << "\" of type "
        << cmState::GetTargetTypeName(tgt->GetType())
        << " may not be linked into another target.  One may link only to "
           "INTERFACE, OBJECT, STATIC or SHARED libraries, or to executables "
           "with the ENABLE_EXPORTS property set.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }

    this->Target->AddLinkLibrary(*this->Makefile, lib, libRef, llt);
  }

  if (warnRemoteInterface) {
    std::ostringstream w;
    /* clang-format off */
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0079) << "\n"
      "Target\n  " << this->Target->GetName() << "\nis not created in this "
      "directory.  For compatibility with older versions of CMake, link "
      "library\n  " << lib << "\nwill be looked up in the directory in "
      "which the target was created rather than in this calling "
      "directory.";
    /* clang-format on */
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
  }

  // Handle (additional) case where the command was called with PRIVATE /
  // LINK_PRIVATE and stop its processing. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall only be populated if it is a
  // STATIC library.)
  if (this->CurrentProcessingState == ProcessingKeywordPrivateInterface ||
      this->CurrentProcessingState == ProcessingPlainPrivateInterface) {
    if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->Target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      std::string configLib =
        this->Target->GetDebugGeneratorExpressions(libRef, llt);
      if (cmGeneratorExpression::IsValidTargetName(libRef) ||
          cmGeneratorExpression::Find(libRef) != std::string::npos) {
        configLib = "$<LINK_ONLY:" + configLib + ">";
      }
      this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
                                   configLib.c_str());
    }
    return true;
  }

  // Handle general case where the command was called with another keyword than
  // PRIVATE / LINK_PRIVATE or none at all. (The "INTERFACE_LINK_LIBRARIES"
  // property of the target on the LHS shall be populated.)
  this->Target->AppendProperty(
    "INTERFACE_LINK_LIBRARIES",
    this->Target->GetDebugGeneratorExpressions(libRef, llt).c_str());

  // Stop processing if called without any keyword.
  if (this->CurrentProcessingState == ProcessingLinkLibraries) {
    return true;
  }
  // Stop processing if policy CMP0022 is set to NEW.
  const cmPolicies::PolicyStatus policy22Status =
    this->Target->GetPolicyStatusCMP0022();
  if (policy22Status != cmPolicies::OLD &&
      policy22Status != cmPolicies::WARN) {
    return true;
  }
  // Stop processing if called with an INTERFACE library on the LHS.
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return true;
  }

  // Handle (additional) backward-compatibility case where the command was
  // called with PUBLIC / INTERFACE / LINK_PUBLIC / LINK_INTERFACE_LIBRARIES.
  // (The policy CMP0022 is not set to NEW.)
  {
    // Get the list of configurations considered to be DEBUG.
    std::vector<std::string> debugConfigs =
      this->Makefile->GetCMakeInstance()->GetDebugConfigs();
    std::string prop;

    // Include this library in the link interface for the target.
    if (llt == DEBUG_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the DEBUG configuration interfaces.
      for (std::string const& dc : debugConfigs) {
        prop = "LINK_INTERFACE_LIBRARIES_";
        prop += dc;
        this->Target->AppendProperty(prop, libRef.c_str());
      }
    }
    if (llt == OPTIMIZED_LibraryType || llt == GENERAL_LibraryType) {
      // Put in the non-DEBUG configuration interfaces.
      this->Target->AppendProperty("LINK_INTERFACE_LIBRARIES", libRef.c_str());

      // Make sure the DEBUG configuration interfaces exist so that the
      // general one will not be used as a fall-back.
      for (std::string const& dc : debugConfigs) {
        prop = "LINK_INTERFACE_LIBRARIES_";
        prop += dc;
        if (!this->Target->GetProperty(prop)) {
          this->Target->SetProperty(prop, "");
        }
      }
    }
  }
  return true;
}